

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall FIX::double_conversion::Bignum::Clamp(Bignum *this)

{
  uint *puVar1;
  bool bVar2;
  Bignum *this_local;
  
  while( true ) {
    bVar2 = false;
    if (0 < this->used_digits_) {
      puVar1 = Vector<unsigned_int>::operator[](&this->bigits_,this->used_digits_ + -1);
      bVar2 = *puVar1 == 0;
    }
    if (!bVar2) break;
    this->used_digits_ = this->used_digits_ + -1;
  }
  if (this->used_digits_ == 0) {
    this->exponent_ = 0;
  }
  return;
}

Assistant:

void Bignum::Clamp() {
  while (used_digits_ > 0 && bigits_[used_digits_ - 1] == 0) {
    used_digits_--;
  }
  if (used_digits_ == 0) {
    // Zero.
    exponent_ = 0;
  }
}